

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int pushDownWhereTerms(Parse *pParse,Select *pSubq,Expr *pWhere,int iCursor,int isLeftJoin)

{
  int iVar1;
  Expr *pEVar2;
  ulong uVar3;
  int iVar4;
  SubstContext x;
  
  if (pWhere == (Expr *)0x0) {
    return 0;
  }
  if ((pSubq->selFlags & 0x2000) != 0) {
    return 0;
  }
  if (pSubq->pWin != (Window *)0x0) {
    return 0;
  }
  if (pSubq->pLimit != (Expr *)0x0) {
    return 0;
  }
  iVar4 = 0;
  for (; pWhere->op == ','; pWhere = pWhere->pLeft) {
    iVar1 = pushDownWhereTerms(pParse,pSubq,pWhere->pRight,iCursor,isLeftJoin);
    iVar4 = iVar4 + iVar1;
  }
  if (isLeftJoin == 0) {
    if ((pWhere->flags & 1) == 0) goto LAB_00197489;
  }
  else {
    if ((pWhere->flags & 1) == 0) {
      return 0;
    }
    if (pWhere->iRightJoinTable != iCursor) {
      return 0;
    }
  }
  if (pWhere->iRightJoinTable != iCursor) {
    return 0;
  }
LAB_00197489:
  iVar1 = sqlite3ExprIsTableConstant(pWhere,iCursor);
  if (iVar1 != 0) {
    for (; pSubq != (Select *)0x0; pSubq = pSubq->pPrior) {
      pEVar2 = sqlite3ExprDup(pParse->db,pWhere,0);
      unsetJoinExpr(pEVar2,-1);
      x.isLeftJoin = 0;
      x.pEList = pSubq->pEList;
      x.pParse = pParse;
      x.iTable = iCursor;
      x.iNewTable = iCursor;
      pEVar2 = substExpr(&x,pEVar2);
      uVar3 = (ulong)(pSubq->selFlags & 8);
      pEVar2 = sqlite3ExprAnd(pParse,*(Expr **)((long)pSubq->addrOpenEphm + uVar3 * 2 + 0x14),pEVar2
                             );
      *(Expr **)((long)pSubq->addrOpenEphm + uVar3 * 2 + 0x14) = pEVar2;
    }
    iVar4 = iVar4 + 1;
  }
  return iVar4;
}

Assistant:

static int pushDownWhereTerms(
  Parse *pParse,        /* Parse context (for malloc() and error reporting) */
  Select *pSubq,        /* The subquery whose WHERE clause is to be augmented */
  Expr *pWhere,         /* The WHERE clause of the outer query */
  int iCursor,          /* Cursor number of the subquery */
  int isLeftJoin        /* True if pSubq is the right term of a LEFT JOIN */
){
  Expr *pNew;
  int nChng = 0;
  if( pWhere==0 ) return 0;
  if( pSubq->selFlags & SF_Recursive ) return 0;  /* restriction (2) */

#ifndef SQLITE_OMIT_WINDOWFUNC
  if( pSubq->pWin ) return 0;    /* restriction (6) */
#endif

#ifdef SQLITE_DEBUG
  /* Only the first term of a compound can have a WITH clause.  But make
  ** sure no other terms are marked SF_Recursive in case something changes
  ** in the future.
  */
  {
    Select *pX;  
    for(pX=pSubq; pX; pX=pX->pPrior){
      assert( (pX->selFlags & (SF_Recursive))==0 );
    }
  }
#endif

  if( pSubq->pLimit!=0 ){
    return 0; /* restriction (3) */
  }
  while( pWhere->op==TK_AND ){
    nChng += pushDownWhereTerms(pParse, pSubq, pWhere->pRight,
                                iCursor, isLeftJoin);
    pWhere = pWhere->pLeft;
  }
  if( isLeftJoin
   && (ExprHasProperty(pWhere,EP_FromJoin)==0
         || pWhere->iRightJoinTable!=iCursor)
  ){
    return 0; /* restriction (4) */
  }
  if( ExprHasProperty(pWhere,EP_FromJoin) && pWhere->iRightJoinTable!=iCursor ){
    return 0; /* restriction (5) */
  }
  if( sqlite3ExprIsTableConstant(pWhere, iCursor) ){
    nChng++;
    while( pSubq ){
      SubstContext x;
      pNew = sqlite3ExprDup(pParse->db, pWhere, 0);
      unsetJoinExpr(pNew, -1);
      x.pParse = pParse;
      x.iTable = iCursor;
      x.iNewTable = iCursor;
      x.isLeftJoin = 0;
      x.pEList = pSubq->pEList;
      pNew = substExpr(&x, pNew);
      if( pSubq->selFlags & SF_Aggregate ){
        pSubq->pHaving = sqlite3ExprAnd(pParse, pSubq->pHaving, pNew);
      }else{
        pSubq->pWhere = sqlite3ExprAnd(pParse, pSubq->pWhere, pNew);
      }
      pSubq = pSubq->pPrior;
    }
  }
  return nChng;
}